

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_portals.cxx
# Opt level: O1

void __thiscall read_portal_v5::operator()(read_portal_v5 *this,portal_data **_portal,xr_reader *r)

{
  float *pfVar1;
  portal_data *ppVar2;
  portal_data *ppVar3;
  float *pfVar4;
  long lVar5;
  
  ppVar2 = (portal_data *)operator_new(0x50);
  (ppVar2->vertices).count = 0;
  *_portal = ppVar2;
  pfVar1 = (float *)(r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)((long)pfVar1 + 2);
  ppVar2->sector_front = *(uint16_t *)pfVar1;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  ppVar2->sector_back = *(uint16_t *)((long)pfVar1 + 2);
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 2);
  (ppVar2->vertices).count = (uint32_t)pfVar1[1];
  lVar5 = 6;
  do {
    pfVar4 = pfVar1 + 3;
    ppVar3 = (portal_data *)((ppVar2->vertices).array[0].field_0.xyz + 2);
    (r->field_2).m_p_u32 = (uint32_t *)pfVar4;
    (ppVar2->vertices).array[0].field_0.field_0.x = pfVar1[2];
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 4);
    (ppVar2->vertices).array[0].field_0.field_0.y = *pfVar4;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 5);
    *(float *)ppVar3 = pfVar1[4];
    lVar5 = lVar5 + -1;
    ppVar2 = ppVar3;
    pfVar1 = pfVar4;
  } while (lVar5 != 0);
  return;
}

Assistant:

void operator()(portal_data*& _portal, xr_reader& r) const {
	portal_data* portal = new portal_data;
	_portal = portal;
	portal->sector_front = r.r_u16();
	portal->sector_back = r.r_u16();
	portal->vertices.count = r.r_u32();
	for (uint_fast32_t i = 0; i != 6; ++i)
		r.r_fvector3(portal->vertices.array[i]);
}